

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Array2D<float> * __thiscall
pbrt::Sample2DFunction
          (Array2D<float> *__return_storage_ptr__,pbrt *this,function<float_(float,_float)> *f,
          int nu,int nv,int nSamples,Bounds2f domain,Allocator alloc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  int nx;
  undefined4 in_register_0000008c;
  allocator_type allocator;
  ulong uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined8 in_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  float fVar16;
  undefined8 in_XMM1_Qb;
  undefined1 auVar17 [16];
  Float invBase_1;
  undefined1 auVar18 [16];
  undefined4 in_XMM7_Da;
  undefined1 in_register_000013c4 [12];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  Tuple2<pbrt::Point2,_float> local_c0;
  ulong local_b8;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_b0;
  uint local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  undefined4 local_84;
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  allocator.memoryResource._4_4_ = in_register_0000008c;
  allocator.memoryResource._0_4_ = nSamples;
  local_68 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_64 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  local_78 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_74 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  nx = (int)f;
  uStack_70 = in_XMM0_Qb;
  uStack_60 = in_XMM1_Qb;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            (&local_b0,(long)nv,(allocator_type *)&local_c0);
  if (0 < nv) {
    uVar7 = 0;
    do {
      auVar11 = ZEXT816(0) << 0x40;
      auVar18 = ZEXT816(0) << 0x40;
      if (uVar7 != 0) {
        lVar8 = 0;
        fVar12 = 1.0;
        uVar6 = uVar7;
        do {
          lVar8 = (lVar8 - uVar6 / 2) * 2 + uVar6;
          fVar12 = fVar12 * 0.5;
          bVar10 = 1 < uVar6;
          uVar6 = uVar6 / 2;
        } while (bVar10);
        auVar18._4_12_ = in_register_000013c4;
        auVar18._0_4_ = in_XMM7_Da;
        auVar18 = vcvtusi2ss_avx512f(auVar18,lVar8);
        auVar18 = ZEXT416((uint)(fVar12 * auVar18._0_4_));
      }
      if (uVar7 != 0) {
        lVar8 = 0;
        fVar12 = 1.0;
        uVar6 = uVar7;
        do {
          lVar8 = (lVar8 - uVar6 / 3) * 3 + uVar6;
          fVar12 = fVar12 * 0.33333334;
          bVar10 = 2 < uVar6;
          uVar6 = uVar6 / 3;
        } while (bVar10);
        auVar11._4_12_ = in_register_000013c4;
        auVar11._0_4_ = in_XMM7_Da;
        auVar11 = vcvtusi2ss_avx512f(auVar11,lVar8);
        auVar11 = ZEXT416((uint)(fVar12 * auVar11._0_4_));
      }
      auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar18);
      auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar11);
      local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].super_Tuple2<pbrt::Point2,_float>.x =
           auVar18._0_4_;
      local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].super_Tuple2<pbrt::Point2,_float>.y =
           auVar11._0_4_;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nv);
  }
  local_c0.x = 0.0;
  local_c0.y = 1.0;
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  local_c0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  local_c0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13);
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  Array2D<float>::Array2D(__return_storage_ptr__,nx,nu,allocator);
  if (0 < nu) {
    local_90 = (float)nx;
    local_94 = (float)nu;
    auVar3._4_4_ = fStack_74;
    auVar3._0_4_ = local_78;
    auVar3._8_8_ = uStack_70;
    local_48 = vmovshdup_avx(auVar3);
    auVar4._4_4_ = fStack_64;
    auVar4._0_4_ = local_68;
    auVar4._8_8_ = uStack_60;
    local_58 = vmovshdup_avx(auVar4);
    local_b8 = 0;
    local_98 = nu;
    do {
      if (0 < nx) {
        local_8c = (float)(int)local_b8;
        iVar9 = 0;
        do {
          if (local_b0.
              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_b0.
              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            fVar12 = 0.0;
          }
          else {
            local_88 = (float)iVar9;
            auVar11 = ZEXT816(0);
            uVar7 = 0;
            do {
              local_80 = auVar11._0_8_;
              fVar12 = (local_88 +
                       local_b0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super_Tuple2<pbrt::Point2,_float>.x) / local_90;
              fVar16 = (local_8c +
                       local_b0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super_Tuple2<pbrt::Point2,_float>.y) / local_94;
              auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * local_68)),
                                        ZEXT416((uint)(1.0 - fVar12)),ZEXT416((uint)local_78));
              auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (float)local_58._0_4_)),
                                        ZEXT416((uint)(1.0 - fVar16)),ZEXT416((uint)local_48._0_4_))
              ;
              local_c0.x = auVar11._0_4_;
              local_84 = auVar18._0_4_;
              if (*(long *)(this + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              auVar15._0_8_ = (**(code **)(this + 0x18))(this,&local_c0,&local_84);
              auVar15._8_56_ = extraout_var;
              auVar2._8_4_ = 0x7fffffff;
              auVar2._0_8_ = 0x7fffffff7fffffff;
              auVar2._12_4_ = 0x7fffffff;
              auVar11 = vandps_avx512vl(auVar15._0_16_,auVar2);
              auVar14._0_8_ = (double)auVar11._0_4_;
              auVar14._8_8_ = auVar11._8_8_;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_80;
              auVar11 = vmaxsd_avx(auVar14,auVar17);
              uVar7 = uVar7 + 1;
            } while (uVar7 < (ulong)((long)local_b0.
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_b0.
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
            fVar12 = (float)auVar11._0_8_;
          }
          iVar1 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
          __return_storage_ptr__->values
          [((__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1) *
           ((int)local_b8 - (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y)
           + (iVar9 - iVar1)] = fVar12;
          iVar9 = iVar9 + 1;
        } while (iVar9 != nx);
      }
      uVar5 = (int)local_b8 + 1;
      local_b8 = (ulong)uVar5;
    } while (uVar5 != local_98);
  }
  if (local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}